

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::Stat(char *path,Stat_t *buf)

{
  int *piVar1;
  allocator local_41;
  string local_40;
  Stat_t *local_20;
  Stat_t *buf_local;
  char *path_local;
  
  local_20 = buf;
  buf_local = (Stat_t *)path;
  if (path == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    path_local._4_4_ = -1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,path,&local_41);
    path_local._4_4_ = Stat(&local_40,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return path_local._4_4_;
}

Assistant:

int SystemTools::Stat(const char* path, SystemTools::Stat_t* buf)
{
  if (!path) {
    errno = EFAULT;
    return -1;
  }
  return SystemTools::Stat(std::string(path), buf);
}